

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O3

UWORD32 ihevcd_bits_nxt(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ps_bitstrm->u4_bit_ofst;
  uVar1 = (ps_bitstrm->u4_cur_word << ((byte)uVar2 & 0x1f)) >> (-(char)u4_numbits & 0x1fU);
  if (0x20 - u4_numbits < uVar2) {
    uVar2 = 0x40 - (uVar2 + u4_numbits);
    uVar3 = 0;
    if (uVar2 < 0x20) {
      uVar3 = ps_bitstrm->u4_nxt_word >> ((byte)uVar2 & 0x1f);
    }
    uVar1 = uVar1 | uVar3;
  }
  return uVar1;
}

Assistant:

UWORD32 ihevcd_bits_nxt(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;

    BITS_NXT(u4_bits_read,
             ps_bitstrm->pu4_buf,
             ps_bitstrm->u4_bit_ofst,
             ps_bitstrm->u4_cur_word,
             ps_bitstrm->u4_nxt_word,
             u4_numbits);
    return u4_bits_read;
}